

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_band.c
# Opt level: O3

void SUNDlsMat_bandGBTRS(sunrealtype **a,sunindextype n,sunindextype smu,sunindextype ml,
                        sunindextype *p,sunrealtype *b)

{
  long lVar1;
  sunrealtype *psVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  sunrealtype *psVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  
  uVar4 = n - 1;
  if (1 < n) {
    psVar6 = b + 1;
    uVar5 = 0;
    do {
      uVar8 = p[uVar5];
      dVar9 = b[uVar8];
      if (uVar8 != uVar5) {
        b[uVar8] = b[uVar5];
        b[uVar5] = dVar9;
      }
      uVar8 = uVar5 + ml;
      if (n <= (long)(uVar5 + ml)) {
        uVar8 = uVar4;
      }
      if ((long)uVar5 < (long)uVar8) {
        psVar2 = a[uVar5];
        lVar7 = 0;
        do {
          psVar6[lVar7] = psVar2[smu + lVar7 + 1] * dVar9 + psVar6[lVar7];
          lVar1 = uVar5 + lVar7;
          lVar7 = lVar7 + 1;
        } while (lVar1 + 1 < (long)uVar8);
      }
      uVar5 = uVar5 + 1;
      psVar6 = psVar6 + 1;
    } while (uVar5 != uVar4);
  }
  if (0 < n) {
    lVar7 = smu * 8 + n * -8;
    do {
      lVar7 = lVar7 + 8;
      psVar6 = a[uVar4];
      uVar5 = uVar4 - smu;
      if ((long)(uVar4 - smu) < 1) {
        uVar5 = 0;
      }
      dVar9 = b[uVar4] / psVar6[smu];
      b[uVar4] = dVar9;
      if (uVar5 < uVar4) {
        do {
          b[uVar5] = *(double *)((long)psVar6 + uVar5 * 8 + lVar7) * -dVar9 + b[uVar5];
          uVar5 = uVar5 + 1;
        } while ((long)uVar5 < (long)uVar4);
      }
      bVar3 = 0 < (long)uVar4;
      uVar4 = uVar4 - 1;
    } while (bVar3);
  }
  return;
}

Assistant:

void SUNDlsMat_bandGBTRS(sunrealtype** a, sunindextype n, sunindextype smu,
                         sunindextype ml, sunindextype* p, sunrealtype* b)
{
  sunindextype k, l, i, first_row_k, last_row_k;
  sunrealtype mult, *diag_k;

  /* Solve Ly = Pb, store solution y in b */

  for (k = 0; k < n - 1; k++)
  {
    l    = p[k];
    mult = b[l];
    if (l != k)
    {
      b[l] = b[k];
      b[k] = mult;
    }
    diag_k     = a[k] + smu;
    last_row_k = SUNMIN(n - 1, k + ml);
    for (i = k + 1; i <= last_row_k; i++) { b[i] += mult * diag_k[i - k]; }
  }

  /* Solve Ux = y, store solution x in b */

  for (k = n - 1; k >= 0; k--)
  {
    diag_k      = a[k] + smu;
    first_row_k = SUNMAX(0, k - smu);
    b[k] /= (*diag_k);
    mult = -b[k];
    for (i = first_row_k; i <= k - 1; i++) { b[i] += mult * diag_k[i - k]; }
  }
}